

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::version(StdOutput *this,CmdLineInterface *_cmd)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  void *this_00;
  string local_58 [8];
  string xversion;
  string local_38 [8];
  string progName;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  iVar1 = (*_cmd->_vptr_CmdLineInterface[10])();
  std::__cxx11::string::string(local_38,(string *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*_cmd->_vptr_CmdLineInterface[9])();
  std::__cxx11::string::string(local_58,(string *)CONCAT44(extraout_var_00,iVar1));
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"  version: ");
  poVar2 = std::operator<<(poVar2,local_58);
  this_00 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

inline void StdOutput::version(CmdLineInterface& _cmd) 
{
	std::string progName = _cmd.getProgramName();
	std::string xversion = _cmd.getVersion();

	std::cout << std::endl << progName << "  version: " 
			  << xversion << std::endl << std::endl;
}